

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

word Exp_Truth6(int nVars,Vec_Int_t *p,word *puFanins)

{
  int iVar1;
  word *puNodes_00;
  word wVar2;
  word wVar3;
  int local_34;
  int i;
  word Res;
  word *puNodes;
  word *puFanins_local;
  Vec_Int_t *p_local;
  int nVars_local;
  
  puNodes = puFanins;
  if (puFanins == (word *)0x0) {
    puNodes = Exp_Truth6::Truth6;
  }
  iVar1 = Exp_NodeNum(p);
  puNodes_00 = (word *)calloc((long)iVar1,8);
  for (local_34 = 0; iVar1 = Exp_NodeNum(p), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(p,local_34 << 1);
    wVar2 = Exp_Truth6Lit(nVars,iVar1,puNodes,puNodes_00);
    iVar1 = Vec_IntEntry(p,local_34 * 2 + 1);
    wVar3 = Exp_Truth6Lit(nVars,iVar1,puNodes,puNodes_00);
    puNodes_00[local_34] = wVar2 & wVar3;
  }
  iVar1 = Vec_IntEntryLast(p);
  wVar2 = Exp_Truth6Lit(nVars,iVar1,puNodes,puNodes_00);
  if (puNodes_00 != (word *)0x0) {
    free(puNodes_00);
  }
  return wVar2;
}

Assistant:

static inline word Exp_Truth6( int nVars, Vec_Int_t * p, word * puFanins )
{
    static word Truth6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    word * puNodes, Res;
    int i;
    if ( puFanins == NULL )
        puFanins = (word *)Truth6;
    puNodes = ABC_CALLOC( word, Exp_NodeNum(p) );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
        puNodes[i] = Exp_Truth6Lit( nVars, Vec_IntEntry(p, 2*i+0), puFanins, puNodes ) & 
                     Exp_Truth6Lit( nVars, Vec_IntEntry(p, 2*i+1), puFanins, puNodes );
    Res = Exp_Truth6Lit( nVars, Vec_IntEntryLast(p), puFanins, puNodes );
    ABC_FREE( puNodes );
    return Res;
}